

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

string * __thiscall
toml::detail::show_char_abi_cxx11_(string *__return_storage_ptr__,detail *this,char c)

{
  byte __c;
  int iVar1;
  pointer pvVar2;
  size_type sVar3;
  allocator<char> local_31;
  int local_30;
  value_type_conflict3 local_2a;
  undefined1 local_29;
  int r;
  array<char,_5UL> buf;
  allocator<char> local_12;
  byte local_11;
  string *psStack_10;
  char c_local;
  
  local_11 = (byte)this;
  psStack_10 = __return_storage_ptr__;
  iVar1 = isgraph((uint)local_11);
  __c = local_11;
  if (iVar1 == 0) {
    local_2a = '\0';
    std::array<char,_5UL>::fill((array<char,_5UL> *)&local_29,&local_2a);
    pvVar2 = std::array<char,_5UL>::data((array<char,_5UL> *)&local_29);
    sVar3 = std::array<char,_5UL>::size((array<char,_5UL> *)&local_29);
    iVar1 = snprintf(pvVar2,sVar3,"0x%02x",(ulong)local_11);
    local_30 = iVar1;
    sVar3 = std::array<char,_5UL>::size((array<char,_5UL> *)&local_29);
    if (iVar1 != (int)sVar3 + -1) {
      __assert_fail("r == static_cast<int>(buf.size()) - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/combinator.hpp"
                    ,0x33,"std::string toml::detail::show_char(const char)");
    }
    pvVar2 = std::array<char,_5UL>::data((array<char,_5UL> *)&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pvVar2,&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,1,__c,&local_12);
    std::allocator<char>::~allocator(&local_12);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string show_char(const char c)
{
    // It suppresses an error that occurs only in Debug mode of MSVC++ on Windows.
    // I'm not completely sure but they check the value of char to be in the
    // range [0, 256) and some of the COMPLETELY VALID utf-8 character sometimes
    // has negative value (if char has sign). So here it re-interprets c as
    // unsigned char through pointer. In general, converting pointer to a
    // pointer that has different type cause UB, but `(signed|unsigned)?char`
    // are one of the exceptions. Converting pointer only to char and std::byte
    // (c++17) are valid.
    if(std::isgraph(*reinterpret_cast<unsigned char const*>(std::addressof(c))))
    {
        return std::string(1, c);
    }
    else
    {
        std::array<char, 5> buf;
        buf.fill('\0');
        const auto r = std::snprintf(
                buf.data(), buf.size(), "0x%02x", static_cast<int>(c) & 0xFF);
        (void) r; // Unused variable warning
        assert(r == static_cast<int>(buf.size()) - 1);
        return std::string(buf.data());
    }
}